

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

char * __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::AllocPages<true>
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,uint pageCount)

{
  PageBitVector *this_00;
  undefined4 *puVar1;
  SecondaryAllocator *pSVar2;
  PageAllocatorBaseCommon *pPVar3;
  HANDLE pVVar4;
  code *pcVar5;
  bool bVar6;
  BOOLEAN BVar7;
  BVIndex BVar8;
  int iVar9;
  uint index;
  uint uVar10;
  BVIndex BVar11;
  BOOL BVar12;
  HANDLE pVVar13;
  AllocatorType *pAVar14;
  undefined8 *in_FS_OFFSET;
  char *local_40;
  DWORD local_38;
  BVIndex local_34;
  DWORD oldProtect;
  
  BVar11 = this->freePageCount;
  if (BVar11 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x152,"(freePageCount != 0)","freePageCount != 0");
    if (!bVar6) goto LAB_00263c3f;
    *puVar1 = 0;
    BVar11 = this->freePageCount;
  }
  this_00 = &this->freePages;
  BVar8 = BVStatic<272UL>::Count(this_00);
  if (BVar11 != BVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x153,"(freePageCount == (uint)this->GetCountOfFreePages())",
                       "freePageCount == (uint)this->GetCountOfFreePages()");
    if (!bVar6) goto LAB_00263c3f;
    *puVar1 = 0;
  }
  if (pageCount <= this->freePageCount) {
    if ((this->freePageCount == 0 && this->decommitPageCount == 0) ||
       ((pSVar2 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                  secondaryAllocator, pSVar2 != (SecondaryAllocator *)0x0 &&
        (iVar9 = (*pSVar2->_vptr_SecondaryAllocator[3])(), (char)iVar9 == '\0')))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x158,"(!IsFull())","!IsFull()");
      if (!bVar6) {
LAB_00263c3f:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar1 = 0;
    }
    index = BVStatic<272UL>::GetNextBit(this_00,0);
    if (index == 0xffffffff) {
      return (char *)0x0;
    }
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    local_34 = index;
    do {
      pPVar3 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
               super_SegmentBaseCommon.allocator;
      pAVar14 = &pPVar3[-1].allocatorType;
      if (pPVar3 == (PageAllocatorBaseCommon *)0x0) {
        pAVar14 = (AllocatorType *)0x0;
      }
      if (pAVar14[0x28] <= index) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x15d,"(index < this->GetAllocator()->GetMaxAllocPageCount())",
                           "index < this->GetAllocator()->GetMaxAllocPageCount()");
        if (!bVar6) goto LAB_00263c3f;
        *puVar1 = 0;
      }
      uVar10 = GetAvailablePageCount(this);
      if (uVar10 - index < pageCount) {
        return (char *)0x0;
      }
      if (pageCount == 1) {
        local_40 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address +
                   (local_34 << 0xc);
        uVar10 = 1;
        index = local_34;
LAB_00263af8:
        BVStatic<272UL>::ClearRange(this_00,index,uVar10);
        BVar8 = this->freePageCount - pageCount;
        this->freePageCount = BVar8;
        BVar11 = BVStatic<272UL>::Count(this_00);
        if (BVar8 != BVar11) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar1 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x177,"(freePageCount == (uint)this->GetCountOfFreePages())",
                             "freePageCount == (uint)this->GetCountOfFreePages()");
          if (!bVar6) goto LAB_00263c3f;
          *puVar1 = 0;
        }
        pPVar3 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                 super_SegmentBaseCommon.allocator;
        pAVar14 = &pPVar3[-1].allocatorType;
        if (pPVar3 == (PageAllocatorBaseCommon *)0x0) {
          pAVar14 = (AllocatorType *)0x0;
        }
        pVVar4 = *(HANDLE *)(pAVar14 + 0x4a);
        pVVar13 = GetCurrentProcess();
        if (pVVar4 != pVVar13) {
          return local_40;
        }
        BVar12 = VirtualProtect(local_40,(ulong)(pageCount << 0xc),4,&local_38);
        if (BVar12 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar1 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x180,"((0))","UNREACHED");
          if (bVar6) {
            *puVar1 = 0;
            return (char *)0x0;
          }
        }
        else {
          if (local_38 == 1) {
            return local_40;
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar1 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x183,"(oldProtect == 0x01)","oldProtect == PAGE_NOACCESS");
          if (bVar6) {
            *puVar1 = 0;
            return local_40;
          }
        }
        goto LAB_00263c3f;
      }
      BVar7 = BVStatic<272UL>::TestRange(this_00,index,pageCount);
      if (BVar7 != '\0') {
        local_40 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address +
                   (index << 0xc);
        uVar10 = pageCount;
        goto LAB_00263af8;
      }
      index = BVStatic<272UL>::GetNextBit(this_00,index + 1);
    } while (index != 0xffffffff);
  }
  return (char *)0x0;
}

Assistant:

char *
PageSegmentBase<T>::AllocPages(uint pageCount)
{
    Assert(freePageCount != 0);
    Assert(freePageCount == (uint)this->GetCountOfFreePages());
    if (freePageCount < pageCount)
    {
        return nullptr;
    }
    Assert(!IsFull());

    uint index = this->GetNextBitInFreePagesBitVector(0);
    while (index != -1)
    {
        Assert(index < this->GetAllocator()->GetMaxAllocPageCount());

        if (GetAvailablePageCount() - index < pageCount)
        {
            break;
        }
        if (pageCount == 1 || this->TestRangeInFreePagesBitVector(index, pageCount))
        {
            char * allocAddress = this->address + index * AutoSystemInfo::PageSize;

            if (pageCount > 1 && !notPageAligned)
            {
                uint nextIndex = 0;
                if (!IsAllocationPageAligned(allocAddress, pageCount, &nextIndex))
                {
                    if (index + nextIndex >= this->GetAllocator()->GetMaxAllocPageCount())
                    {
                        return nullptr;
                    }
                    index = this->freePages.GetNextBit(index + nextIndex);
                    continue;
                }
            }

            this->ClearRangeInFreePagesBitVector(index, pageCount);
            freePageCount -= pageCount;
            Assert(freePageCount == (uint)this->GetCountOfFreePages());

#ifdef PAGEALLOCATOR_PROTECT_FREEPAGE
            if (this->GetAllocator()->processHandle == GetCurrentProcess())
            {
                DWORD oldProtect;
                BOOL vpresult = VirtualProtect(allocAddress, pageCount * AutoSystemInfo::PageSize, PAGE_READWRITE, &oldProtect);
                if (vpresult == FALSE)
                {
                    Assert(UNREACHED);
                    return nullptr;
                }
                Assert(oldProtect == PAGE_NOACCESS);
            }
#endif
            return allocAddress;
        }
        index = this->GetNextBitInFreePagesBitVector(index + 1);
    }
    return nullptr;
}